

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void __thiscall CFG::dumpDOT(CFG *this,string *fileName)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ofstream fout;
  string local_240;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(string *)fileName,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    toDOT_abi_cxx11_(&local_240,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,local_240._M_dataplus._M_p,local_240._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    std::ofstream::close();
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Unable to write file: ","");
  std::operator+(__return_storage_ptr__,&local_240,fileName);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void CFG::dumpDOT(const std::string& fileName) {
	std::ofstream fout(fileName);
	if (!fout.is_open())
		throw std::string("Unable to write file: ") + fileName;

	fout << this->toDOT();
	fout.close();
}